

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall
irr::video::CNullDriver::draw3DBox(CNullDriver *this,aabbox3d<float> *box,SColor color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined8 local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined8 local_80;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  undefined8 local_5c;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  undefined8 local_44;
  float local_3c;
  
  fVar5 = (box->MaxEdge).Z;
  local_78 = ((box->MinEdge).Z + fVar5) * 0.5;
  fVar5 = local_78 - fVar5;
  local_90 = local_78 + fVar5;
  uVar1 = (box->MinEdge).X;
  uVar3 = (box->MinEdge).Y;
  uVar2 = (box->MaxEdge).X;
  uVar4 = (box->MaxEdge).Y;
  local_68 = ((float)uVar1 + (float)uVar2) * 0.5;
  local_88 = ((float)uVar3 + (float)uVar4) * 0.5;
  local_8c = local_68 + (local_68 - (float)uVar2);
  local_64 = local_88 + (local_88 - (float)uVar4);
  local_98 = CONCAT44(local_64,local_8c);
  local_78 = local_78 - fVar5;
  local_68 = local_68 - (local_68 - (float)uVar2);
  local_88 = local_88 - (local_88 - (float)uVar4);
  local_5c = CONCAT44(local_88,local_68);
  local_84 = local_90;
  local_80 = local_98;
  local_74 = local_8c;
  local_70 = local_88;
  local_6c = local_78;
  local_60 = local_90;
  local_54 = local_90;
  local_50 = local_68;
  local_4c = local_64;
  local_48 = local_78;
  local_44 = local_5c;
  local_3c = local_78;
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_5c,&local_8c,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_8c,&local_74,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_74,&local_44,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_44,&local_5c,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_98,&local_80,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_80,&local_50,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_50,&local_68,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_68,&local_98,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_8c,&local_98,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_74,&local_80,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_44,&local_50,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&local_5c,&local_68,(ulong)color.color);
  return;
}

Assistant:

void CNullDriver::draw3DBox(const core::aabbox3d<f32> &box, SColor color)
{
	core::vector3df edges[8];
	box.getEdges(edges);

	// TODO: optimize into one big drawIndexPrimitive call.

	draw3DLine(edges[5], edges[1], color);
	draw3DLine(edges[1], edges[3], color);
	draw3DLine(edges[3], edges[7], color);
	draw3DLine(edges[7], edges[5], color);
	draw3DLine(edges[0], edges[2], color);
	draw3DLine(edges[2], edges[6], color);
	draw3DLine(edges[6], edges[4], color);
	draw3DLine(edges[4], edges[0], color);
	draw3DLine(edges[1], edges[0], color);
	draw3DLine(edges[3], edges[2], color);
	draw3DLine(edges[7], edges[6], color);
	draw3DLine(edges[5], edges[4], color);
}